

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireEmptyHandTest::
expectTryingAddCardAndClearIt<solitaire::piles::FoundationPileMock>
          (SolitaireEmptyHandTest *this,FoundationPileMock *pile,
          optional<solitaire::cards::Card> *card)

{
  TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)> *this_00;
  anon_class_1_0_00000001 local_69;
  Action<void_(std::optional<solitaire::cards::Card>_&)> local_68;
  MatcherBase<std::optional<solitaire::cards::Card>_&> local_48;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_30;
  
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher
            ((Matcher<std::optional<solitaire::cards::Card>_&> *)&local_48,card);
  piles::FoundationPileMock::gmock_tryAddCard
            (&local_30,pile,(Matcher<std::optional<solitaire::cards::Card>_&> *)&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::
            InternalExpectedAt(&local_30,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,200,"pile","tryAddCard(card)");
  testing::Action<void(std::optional<solitaire::cards::Card>&)>::
  Action<solitaire::SolitaireEmptyHandTest::expectTryingAddCardAndClearIt<solitaire::piles::FoundationPileMock>(solitaire::piles::FoundationPileMock&,std::optional<solitaire::cards::Card>&)::_lambda(auto:1&)_1_,void>
            (&local_68,&local_69);
  testing::internal::TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)>::WillOnce
            (this_00,&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&local_30.matchers_);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase(&local_48);
  return;
}

Assistant:

void expectTryingAddCardAndClearIt(Pile& pile, std::optional<Card>& card) {
        EXPECT_CALL(pile, tryAddCard(card))
            .WillOnce(Invoke([](auto& card) {card = std::nullopt;}));
    }